

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void UpdateCostAtIndex(CostManager *manager,int i,int do_clean_intervals)

{
  int iVar1;
  CostInterval *pCVar2;
  CostInterval *interval;
  
  pCVar2 = manager->head_;
  while ((interval = pCVar2, interval != (CostInterval *)0x0 && (interval->start_ <= i))) {
    pCVar2 = interval->next_;
    if (i < interval->end_) {
      if (interval->cost_ < manager->costs_[i]) {
        iVar1 = interval->index_;
        manager->costs_[i] = interval->cost_;
        manager->dist_array_[i] = ((short)i - (short)iVar1) + 1;
      }
    }
    else if (do_clean_intervals != 0) {
      PopInterval(manager,interval);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateCostAtIndex(CostManager* const manager, int i,
                                          int do_clean_intervals) {
  CostInterval* current = manager->head_;

  while (current != NULL && current->start_ <= i) {
    CostInterval* const next = current->next_;
    if (current->end_ <= i) {
      if (do_clean_intervals) {
        // We have an outdated interval, remove it.
        PopInterval(manager, current);
      }
    } else {
      UpdateCost(manager, i, current->index_, current->cost_);
    }
    current = next;
  }
}